

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O3

string * __thiscall
Progress::formatTime_abi_cxx11_(string *__return_storage_ptr__,Progress *this,time_t t)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  char *__format;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char buffer [128];
  char local_98 [136];
  
  uVar5 = (ulong)(uint)((int)(t % 0x15180) / 0xe10);
  iVar4 = (int)t + ((int)(SUB168(SEXT816(t) * SEXT816(0x48d159e26af37c05),8) >> 10) -
                   (SUB164(SEXT816(t) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f)) * -0xe10;
  uVar1 = ((uint)((short)iVar4 * -0x7777) >> 0x10) + iVar4;
  uVar6 = (ulong)(uint)(int)(short)(((short)uVar1 >> 5) + (short)((uVar1 & 0xffff) >> 0xf));
  uVar1 = (int)t + ((int)(SUB168(SEXT816(t) * ZEXT816(0x8888888888888889),8) >> 5) -
                   (SUB164(SEXT816(t) * ZEXT816(0x8888888888888889),0xc) >> 0x1f)) * -0x3c;
  if ((int)(t / 0x15180) == 0) {
    if (t % 0x15180 + 0xe0fU < 0x1c1f) {
      snprintf(local_98,0x80,"%02d:%02d",uVar6,(ulong)uVar1);
      goto LAB_001051aa;
    }
    __format = "%d:%02d:%02d";
    uVar7 = (ulong)uVar1;
    uVar3 = uVar5;
    uVar5 = uVar6;
  }
  else {
    __format = "%dd %d:%02d:%02d";
    uVar3 = t / 0x15180;
    uVar7 = uVar6;
  }
  snprintf(local_98,0x80,__format,uVar3,uVar5,uVar7);
LAB_001051aa:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_98,local_98 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Progress::formatTime (time_t t)
{
  char buffer [128];

  int days    =  t          / 86400;
  int hours   = (t % 86400) / 3600;
  int minutes = (t %  3600) / 60;
  int seconds =  t % 60;

  if (days)
    snprintf (buffer, 128, "%dd %d:%02d:%02d", days, hours, minutes, seconds);
  else if (hours)
    snprintf (buffer, 128,     "%d:%02d:%02d",       hours, minutes, seconds);
  else
    snprintf (buffer, 128,        "%02d:%02d",              minutes, seconds);

  return std::string (buffer);
}